

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O2

void chaiscript::bootstrap::standard_library::
     random_access_container_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
               (string *param_1,Module *m)

{
  allocator<char> local_6a [2];
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_68;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Value&(std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>&,int),chaiscript::bootstrap::standard_library::random_access_container_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>&,int)_1_>,chaiscript::bootstrap::standard_library::random_access_container_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>&,int)_1_>
            ((anon_class_1_0_00000001_for_m_f *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"[]",local_6a);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&m->m_funcs,&local_58,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Value_const&(std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&,int),chaiscript::bootstrap::standard_library::random_access_container_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&,int)_1_>,chaiscript::bootstrap::standard_library::random_access_container_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&,int)_1_>
            ((anon_class_1_0_00000001_for_m_f *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"[]",local_6a);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&m->m_funcs,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void random_access_container_type(const std::string & /*type*/, Module &m) {
    // In the interest of runtime safety for the m, we prefer the at() method for [] access,
    // to throw an exception in an out of bounds condition.
    m.add(fun([](ContainerType &c, int index) -> typename ContainerType::reference {
            /// \todo we are preferring to keep the key as 'int' to avoid runtime conversions
            /// during dispatch. reevaluate
            return c.at(static_cast<typename ContainerType::size_type>(index));
          }),
          "[]");

    m.add(fun([](const ContainerType &c, int index) -> typename ContainerType::const_reference {
            /// \todo we are preferring to keep the key as 'int' to avoid runtime conversions
            /// during dispatch. reevaluate
            return c.at(static_cast<typename ContainerType::size_type>(index));
          }),
          "[]");
  }